

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture2DProjLod3(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  Functional local_50 [16];
  tcu local_40 [16];
  undefined8 local_30;
  undefined8 uStack_28;
  
  fVar1 = c->in[0].m_data[2];
  texture2D(local_50,c,c->in[0].m_data[0] / fVar1,c->in[0].m_data[1] / fVar1,c->in[1].m_data[0]);
  tcu::operator*(local_40,(Vector<float,_4> *)local_50,&p->scale);
  tcu::operator+((tcu *)&local_30,(Vector<float,_4> *)local_40,&p->bias);
  *(undefined8 *)(c->color).m_data = local_30;
  *(undefined8 *)((c->color).m_data + 2) = uStack_28;
  return;
}

Assistant:

static void		evalTexture2DProjLod3	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2D(c, c.in[0].x()/c.in[0].z(), c.in[0].y()/c.in[0].z(), c.in[1].x())*p.scale + p.bias; }